

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  unsigned_long *puVar2;
  uint64_t __sd;
  ostream *poVar3;
  result_type seed_00;
  undefined1 local_ce0 [8];
  RandEngine nextSeed;
  size_t i;
  Fuzzer fuzzer;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2a0;
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  byte local_201;
  anon_class_8_1_89917b6f aStack_200;
  bool verbose;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  undefined1 local_160 [8];
  optional<unsigned_long> seed;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  Options local_100 [8];
  Options options;
  allocator<char> local_39;
  string local_38 [8];
  string WasmFuzzTypesOption;
  char **argv_local;
  int argc_local;
  
  WasmFuzzTypesOption.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"wasm-fuzz-types options",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"wasm-fuzz-types",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"Fuzz type construction, canonicalization, and operations",
             (allocator<char> *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0xf);
  wasm::Options::Options(local_100,local_120,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0xf);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"--seed",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"Run a single workload generated by the given seed",&local_1d1);
  aStack_200.seed = (optional<unsigned_long> *)local_160;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1f8,
             &stack0xfffffffffffffe00);
  wasm::Options::add((string *)local_100,local_180,local_1a8,local_1d0,(Arguments)local_38,
                     (function *)0x1,SUB81(&local_1f8,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  local_201 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"--verbose",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"-v",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"Print extra information",&local_279)
  ;
  fuzzer.rand._40_8_ = &local_201;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_2a0,
             (anon_class_8_1_9847ac62 *)&fuzzer.rand.features);
  wasm::Options::add((string *)local_100,local_228,local_250,local_278,(Arguments)local_38,
                     (function *)0x0,SUB81(&local_2a0,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2a0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  wasm::Options::parse((int)local_100,(char **)(ulong)(uint)argc);
  wasm::Fuzzer::Fuzzer((Fuzzer *)&i,(bool)(local_201 & 1));
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_160);
  if (!bVar1) {
    nextSeed._M_p = 0;
    __sd = wasm::getSeed();
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)local_ce0,__sd);
    do {
      poVar3 = std::operator<<((ostream *)&std::cout,"Iteration ");
      nextSeed._M_p = nextSeed._M_p + 1;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,nextSeed._M_p);
      std::operator<<(poVar3,"\n");
      seed_00 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                              *)local_ce0);
      wasm::Fuzzer::run((Fuzzer *)&i,seed_00);
    } while( true );
  }
  puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)local_160);
  wasm::Fuzzer::run((Fuzzer *)&i,*puVar2);
  wasm::Fuzzer::~Fuzzer((Fuzzer *)&i);
  wasm::Options::~Options(local_100);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  using namespace wasm;

  const std::string WasmFuzzTypesOption = "wasm-fuzz-types options";

  Options options("wasm-fuzz-types",
                  "Fuzz type construction, canonicalization, and operations");

  std::optional<uint64_t> seed;
  options.add("--seed",
              "",
              "Run a single workload generated by the given seed",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                seed = uint64_t(std::stoull(arg));
              });

  bool verbose = false;
  options.add("--verbose",
              "-v",
              "Print extra information",
              WasmFuzzTypesOption,
              Options::Arguments::Zero,
              [&](Options*, const std::string& arg) { verbose = true; });

  options.parse(argc, argv);

  Fuzzer fuzzer{verbose};
  if (seed) {
    // Run just a single workload with the given seed.
    fuzzer.run(*seed);
  } else {
    // Continuously run workloads with new randomly generated seeds.
    size_t i = 0;
    RandEngine nextSeed(getSeed());
    while (true) {
      std::cout << "Iteration " << ++i << "\n";
      fuzzer.run(nextSeed());
    }
  }
  return 0;
}